

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::UListLeaf::insert
          (UListLeaf *this,LeafData *ld)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Lhs local_38;
  
  local_38.super_SelectedLiteral.litIdx = (ld->super_SelectedLiteral).litIdx;
  local_38.super_SelectedLiteral.cl = (ld->super_SelectedLiteral).cl;
  local_38.super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = (ld->super_SelectedLiteral).interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._isSome;
  if (local_38.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._isSome == true) {
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._21_7_ = 0;
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._0_5_ =
         *(uint5 *)&(ld->super_SelectedLiteral).interpreted.
                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ._elem._elem & 0xffffffff03;
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._5_3_ = 0;
    uVar2 = *(undefined8 *)
             ((long)&(ld->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 9);
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._9_3_ = (undefined3)uVar2;
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._8_4_ =
         (uint)(uint3)local_38.super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem._9_3_ << 8;
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._12_4_ = (undefined4)((ulong)uVar2 >> 0x18);
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)uVar2 >> 0x38);
    uVar1 = *(undefined4 *)
             ((long)&(ld->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 0x11);
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._17_3_ = (undefined3)uVar1;
    local_38.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)uVar1 >> 0x18);
  }
  ::Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::push(&local_38,&this->_children);
  this->_size = this->_size + 1;
  return;
}

Assistant:

inline
  void insert(LeafData ld) final override
  {
    LDList::push(ld, _children);
    _size++;
  }